

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.hpp
# Opt level: O3

void traverse_tree_sim<PredictionData<double,unsigned_long>,double>
               (WorkerForSimilarity *workspace,
               PredictionData<double,_unsigned_long> *prediction_data,IsoForest *model_outputs,
               vector<IsoTree,_std::allocator<IsoTree>_> *trees,size_t curr_tree,bool as_kernel)

{
  ulong *puVar1;
  MissingAction MVar2;
  pointer pIVar3;
  double *pdVar4;
  pointer pdVar5;
  ulong uVar6;
  char *split_categ;
  char *pcVar7;
  size_t n;
  pointer pdVar8;
  unsigned_long uVar9;
  ulong *puVar10;
  pointer puVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  size_t *psVar15;
  undefined1 as_kernel_00;
  ulong *puVar16;
  ulong uVar17;
  double *pdVar18;
  pointer puVar19;
  ulong uVar20;
  undefined7 in_register_00000089;
  long lVar21;
  ulong uVar22;
  pointer puVar23;
  size_t i;
  long lVar24;
  double dVar25;
  double dVar26;
  undefined1 auVar27 [16];
  size_t local_a0;
  size_t end_NA;
  size_t st_NA;
  size_t split_ix;
  IsoForest *local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ix_arr;
  vector<double,_std::allocator<double>_> weights_arr;
  
  if (interrupt_switch) {
    return;
  }
  uVar12 = workspace->st;
  uVar17 = workspace->end;
  if (uVar12 == uVar17) {
    return;
  }
  if ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar11 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar23 = puVar11 + uVar12;
    puVar19 = puVar11 + uVar17 + 1;
    local_80 = model_outputs;
    if (puVar23 != puVar19) {
      uVar12 = (long)puVar19 - (long)puVar23 >> 3;
      lVar13 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar23,puVar19,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar23,puVar19);
      puVar11 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar12 = workspace->st;
    }
    if (workspace->n_from <= puVar11[uVar12]) {
      return;
    }
    uVar17 = workspace->end;
    model_outputs = local_80;
    if (puVar11[uVar17] < workspace->n_from) {
      return;
    }
  }
  pIVar3 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar3[curr_tree].tree_left == 0) {
    dVar25 = pIVar3[curr_tree].remainder;
    pdVar4 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar4 == (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      if (!as_kernel) {
        lVar13 = (uVar17 - uVar12) + 1;
        auVar27._8_4_ = (int)((ulong)lVar13 >> 0x20);
        auVar27._0_8_ = lVar13;
        auVar27._12_4_ = 0x45300000;
        dVar25 = dVar25 + (auVar27._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0);
        pdVar4 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar4 != (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          psVar15 = (workspace->ix_arr).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          sVar14 = prediction_data->nrows;
          if (workspace->assume_full_distr == false) {
            dVar25 = expected_separation_depth<double>(dVar25);
          }
          else {
            dVar25 = 3.0;
          }
          increase_comb_counter(psVar15,uVar12,uVar17,sVar14,pdVar4,dVar25);
          return;
        }
        pdVar4 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (pdVar4 == (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          return;
        }
        psVar15 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar14 = workspace->n_from;
        n = prediction_data->nrows;
        if (workspace->assume_full_distr == false) {
          dVar25 = expected_separation_depth<double>(dVar25);
        }
        else {
          dVar25 = 3.0;
        }
        increase_comb_counter_in_groups(psVar15,uVar12,uVar17,sVar14,n,pdVar4,dVar25);
        return;
      }
      pdVar8 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar8 != pdVar5) {
        if (uVar17 <= uVar12) {
          return;
        }
        puVar23 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar13 = (long)pdVar5 - (long)pdVar8 >> 3;
        do {
          uVar20 = puVar23[uVar12];
          uVar12 = uVar12 + 1;
          sVar14 = prediction_data->nrows;
          lVar21 = sVar14 - uVar20;
          uVar22 = uVar12;
          do {
            uVar6 = puVar23[uVar22];
            if (uVar20 < uVar6) {
              lVar24 = uVar6 + (lVar13 - uVar20) + ~((ulong)((lVar21 + -1) * lVar21) >> 1);
            }
            else {
              lVar24 = sVar14 - uVar6;
              lVar24 = ((uVar20 + lVar13) - uVar6) + ~((ulong)((lVar24 + -1) * lVar24) >> 1);
            }
            pdVar8[lVar24] = pdVar8[lVar24] + 1.0;
            uVar22 = uVar22 + 1;
          } while (uVar22 <= uVar17);
        } while (uVar12 != uVar17);
        return;
      }
      pdVar8 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar8 == (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        return;
      }
      puVar23 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar1 = puVar23 + uVar12;
      uVar20 = (long)((long)puVar23 + (uVar17 * 8 - (long)puVar1) + 8) >> 3;
      puVar16 = puVar1;
      if (0 < (long)uVar20) {
        do {
          uVar22 = uVar20 >> 1;
          uVar20 = ~uVar22 + uVar20;
          puVar10 = puVar16 + uVar22 + 1;
          if (workspace->n_from <= puVar16[uVar22]) {
            uVar20 = uVar22;
            puVar10 = puVar16;
          }
          puVar16 = puVar10;
        } while (0 < (long)uVar20);
      }
      uVar20 = ((long)puVar16 - (long)puVar1 >> 3) + uVar12;
      if (uVar20 <= uVar12) {
        return;
      }
      sVar14 = workspace->n_from;
      do {
        if (uVar20 <= uVar17) {
          lVar13 = puVar23[uVar12] * sVar14;
          uVar22 = uVar20;
          do {
            lVar21 = puVar23[uVar22] - sVar14;
            pdVar8[lVar13 + lVar21] = pdVar8[lVar13 + lVar21] + 1.0;
            uVar22 = uVar22 + 1;
          } while (uVar22 <= uVar17);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar20);
      return;
    }
    if (as_kernel) {
      pdVar8 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar8 != pdVar5) {
        if (uVar17 <= uVar12) {
          return;
        }
        puVar23 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        lVar13 = (long)pdVar5 - (long)pdVar8 >> 3;
        do {
          uVar20 = puVar23[uVar12];
          dVar25 = pdVar4[uVar20];
          uVar12 = uVar12 + 1;
          sVar14 = prediction_data->nrows;
          lVar21 = sVar14 - uVar20;
          uVar22 = uVar12;
          do {
            uVar6 = puVar23[uVar22];
            if (uVar20 < uVar6) {
              lVar24 = (lVar13 - uVar20) + uVar6 + ~((ulong)((lVar21 + -1) * lVar21) >> 1);
            }
            else {
              lVar24 = sVar14 - uVar6;
              lVar24 = ((uVar20 + lVar13) - uVar6) + ~((ulong)((lVar24 + -1) * lVar24) >> 1);
            }
            pdVar8[lVar24] = pdVar4[uVar6] * dVar25 + pdVar8[lVar24];
            uVar22 = uVar22 + 1;
          } while (uVar22 <= uVar17);
        } while (uVar12 != uVar17);
        return;
      }
      pdVar8 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar8 == (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        return;
      }
      puVar23 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar1 = puVar23 + uVar12;
      uVar20 = (long)((long)puVar23 + (uVar17 * 8 - (long)puVar1) + 8) >> 3;
      puVar16 = puVar1;
      if (0 < (long)uVar20) {
        do {
          uVar22 = uVar20 >> 1;
          uVar20 = ~uVar22 + uVar20;
          puVar10 = puVar16 + uVar22 + 1;
          if (workspace->n_from <= puVar16[uVar22]) {
            uVar20 = uVar22;
            puVar10 = puVar16;
          }
          puVar16 = puVar10;
        } while (0 < (long)uVar20);
      }
      uVar20 = ((long)puVar16 - (long)puVar1 >> 3) + uVar12;
      if (uVar20 <= uVar12) {
        return;
      }
      sVar14 = workspace->n_from;
      do {
        if (uVar20 <= uVar17) {
          lVar13 = sVar14 * puVar23[uVar12];
          dVar25 = pdVar4[puVar23[uVar12]];
          uVar22 = uVar20;
          do {
            lVar21 = puVar23[uVar22] - sVar14;
            pdVar8[lVar13 + lVar21] = pdVar4[puVar23[uVar22]] * dVar25 + pdVar8[lVar13 + lVar21];
            uVar22 = uVar22 + 1;
          } while (uVar22 <= uVar17);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar20);
      return;
    }
    if (workspace->assume_full_distr != false) {
      pdVar18 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pdVar18 !=
          (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar23 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar14 = prediction_data->nrows;
        dVar25 = 3.0;
        goto LAB_0024c791;
      }
      pdVar18 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pdVar18 ==
          (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return;
      }
      puVar23 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_a0 = workspace->n_from;
      sVar14 = prediction_data->nrows;
      dVar25 = 3.0;
      goto LAB_0024cea3;
    }
    if (uVar12 == uVar17) {
      dVar25 = dVar25 + 0.0;
      pdVar18 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pdVar18 !=
          (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar23 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar14 = prediction_data->nrows;
LAB_0024c78c:
        dVar25 = expected_separation_depth<double>(dVar25);
LAB_0024c791:
        increase_comb_counter(puVar23,uVar12,uVar17,sVar14,pdVar18,pdVar4,dVar25);
        return;
      }
      pdVar18 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pdVar18 ==
          (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return;
      }
      puVar23 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_a0 = workspace->n_from;
      sVar14 = prediction_data->nrows;
    }
    else {
      lVar13 = uVar12 * 8;
      dVar26 = 0.0;
      do {
        dVar26 = dVar26 + pdVar4[*(long *)((long)(workspace->ix_arr).
                                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + lVar13)
                                ];
        lVar13 = lVar13 + 8;
      } while (uVar17 * 8 - lVar13 != 0);
      dVar25 = dVar25 + dVar26;
      pdVar18 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pdVar18 !=
          (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        puVar23 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        sVar14 = prediction_data->nrows;
        goto LAB_0024c78c;
      }
      pdVar18 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (pdVar18 ==
          (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        return;
      }
      puVar23 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_a0 = workspace->n_from;
      sVar14 = prediction_data->nrows;
    }
    dVar25 = expected_separation_depth<double>(dVar25);
LAB_0024cea3:
    increase_comb_counter_in_groups(puVar23,uVar12,uVar17,local_a0,sVar14,pdVar18,pdVar4,dVar25);
    return;
  }
  local_80 = (IsoForest *)CONCAT44(local_80._4_4_,(int)CONCAT71(in_register_00000089,as_kernel));
  if (curr_tree != 0 && !as_kernel) {
    pdVar4 = (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar4 == (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      pdVar4 = (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (pdVar4 != (workspace->rmat).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
        psVar15 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar18 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (pdVar18 ==
            (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          increase_comb_counter_in_groups
                    (psVar15,uVar12,uVar17,workspace->n_from,prediction_data->nrows,pdVar4,-1.0);
        }
        else {
          increase_comb_counter_in_groups
                    (psVar15,uVar12,uVar17,workspace->n_from,prediction_data->nrows,pdVar4,pdVar18,
                     -1.0);
        }
      }
    }
    else {
      psVar15 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar18 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start;
      if (pdVar18 ==
          (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        increase_comb_counter(psVar15,uVar12,uVar17,prediction_data->nrows,pdVar4,-1.0);
      }
      else {
        increase_comb_counter(psVar15,uVar12,uVar17,prediction_data->nrows,pdVar4,pdVar18,-1.0);
      }
    }
  }
  if ((prediction_data->Xc_indptr != (unsigned_long *)0x0) &&
     ((workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (workspace->tmat_sep).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    puVar11 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar23 = puVar11 + workspace->st;
    puVar11 = puVar11 + workspace->end + 1;
    if (puVar23 != puVar11) {
      uVar12 = (long)puVar11 - (long)puVar23 >> 3;
      lVar13 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar23,puVar11,((uint)lVar13 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar23,puVar11);
    }
  }
  pIVar3 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pIVar3[curr_tree].col_type == Categorical) {
    if (model_outputs->cat_split_type == SubSet) {
      split_categ = pIVar3[curr_tree].cat_split.
                    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
      pcVar7 = *(pointer *)
                ((long)&pIVar3[curr_tree].cat_split.
                        super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl + 8);
      if (pcVar7 == split_categ) {
        divide_subset_split((workspace->ix_arr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            prediction_data->categ_data +
                            pIVar3[curr_tree].col_num * prediction_data->nrows,workspace->st,
                            workspace->end,model_outputs->missing_action,
                            model_outputs->new_cat_action,
                            pIVar3[curr_tree].pct_tree_left <= 0.5 &&
                            pIVar3[curr_tree].pct_tree_left != 0.5,&st_NA,&end_NA,&split_ix);
      }
      else {
        divide_subset_split((workspace->ix_arr).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            prediction_data->categ_data +
                            pIVar3[curr_tree].col_num * prediction_data->nrows,workspace->st,
                            workspace->end,split_categ,(int)pcVar7 - (int)split_categ,
                            model_outputs->missing_action,model_outputs->new_cat_action,
                            pIVar3[curr_tree].pct_tree_left <= 0.5 &&
                            pIVar3[curr_tree].pct_tree_left != 0.5,&st_NA,&end_NA,&split_ix);
      }
    }
    else if (model_outputs->cat_split_type == SingleCateg) {
      divide_subset_split((workspace->ix_arr).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          prediction_data->categ_data +
                          pIVar3[curr_tree].col_num * prediction_data->nrows,workspace->st,
                          workspace->end,pIVar3[curr_tree].chosen_cat,model_outputs->missing_action,
                          &st_NA,&end_NA,&split_ix);
    }
  }
  else if (pIVar3[curr_tree].col_type == Numeric) {
    psVar15 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (prediction_data->Xc_indptr == (unsigned_long *)0x0) {
      divide_subset_split<double>
                (psVar15,prediction_data->numeric_data +
                         pIVar3[curr_tree].col_num * prediction_data->nrows,workspace->st,
                 workspace->end,pIVar3[curr_tree].num_split,model_outputs->missing_action,&st_NA,
                 &end_NA,&split_ix);
    }
    else {
      divide_subset_split<double,unsigned_long>
                (psVar15,workspace->st,workspace->end,pIVar3[curr_tree].col_num,prediction_data->Xc,
                 prediction_data->Xc_ind,prediction_data->Xc_indptr,pIVar3[curr_tree].num_split,
                 model_outputs->missing_action,&st_NA,&end_NA,&split_ix);
    }
  }
  uVar12 = workspace->end;
  MVar2 = model_outputs->missing_action;
  if (((model_outputs->new_cat_action == Weighted) && (model_outputs->cat_split_type == SubSet)) &&
     (prediction_data->categ_data != (int *)0x0)) {
    if ((MVar2 == Fail) &&
       ((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
        super__Vector_impl_data._M_start[curr_tree].col_type == Numeric)) {
      st_NA = split_ix;
      end_NA = split_ix;
    }
LAB_0024cb85:
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar17 = workspace->st;
    if (uVar17 < end_NA) {
      pdVar8 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<double,std::allocator<double>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                ((vector<double,std::allocator<double>> *)&weights_arr,pdVar8,pdVar8 + end_NA);
      puVar23 = (workspace->ix_arr).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&ix_arr,puVar23,
                 puVar23 + end_NA);
      uVar17 = workspace->st;
    }
    if (uVar17 < end_NA) {
      workspace->end = end_NA - 1;
      pIVar3 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (st_NA < end_NA) {
        puVar23 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar8 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar14 = st_NA;
        do {
          uVar9 = puVar23[sVar14];
          pdVar8[uVar9] = pIVar3[curr_tree].pct_tree_left * pdVar8[uVar9];
          sVar14 = sVar14 + 1;
        } while (end_NA != sVar14);
      }
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,pIVar3[curr_tree].tree_left,
                 local_80._0_1_);
    }
    if (st_NA <= uVar12) {
      workspace->st = st_NA;
      workspace->end = uVar12;
      if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start !=
          weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        memmove((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start,
                weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start,
                (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
        if ((long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          memmove((workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
        }
        if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage !=
            weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                    (&weights_arr);
        }
        if (ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        if (ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage !=
            ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
          std::__shrink_to_fit_aux<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true>
          ::_S_do_it(&ix_arr);
        }
      }
      pIVar3 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (st_NA < end_NA) {
        puVar23 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar8 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        sVar14 = st_NA;
        do {
          uVar9 = puVar23[sVar14];
          pdVar8[uVar9] = (1.0 - pIVar3[curr_tree].pct_tree_left) * pdVar8[uVar9];
          sVar14 = sVar14 + 1;
        } while (end_NA != sVar14);
      }
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,pIVar3[curr_tree].tree_right,
                 local_80._0_1_);
    }
    if (ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)ix_arr.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)weights_arr.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    as_kernel_00 = SUB81(local_80,0);
    if (MVar2 == Impute) {
      psVar15 = &st_NA;
      if (0.5 <= (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].pct_tree_left) {
        psVar15 = &end_NA;
      }
      split_ix = *psVar15;
    }
    else {
      if (MVar2 == Divide) goto LAB_0024cb85;
      if (MVar2 != Fail) {
        return;
      }
    }
    if (workspace->st < split_ix) {
      workspace->end = split_ix - 1;
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,
                 (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].tree_left,(bool)as_kernel_00);
      as_kernel_00 = SUB81(local_80,0);
    }
    if (split_ix <= uVar12) {
      workspace->st = split_ix;
      workspace->end = uVar12;
      traverse_tree_sim<PredictionData<double,unsigned_long>,double>
                (workspace,prediction_data,model_outputs,trees,
                 (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start[curr_tree].tree_right,(bool)as_kernel_00);
    }
  }
  return;
}

Assistant:

void traverse_tree_sim(WorkerForSimilarity   &workspace,
                       PredictionData        &prediction_data,
                       IsoForest             &model_outputs,
                       std::vector<IsoTree>  &trees,
                       size_t                curr_tree,
                       const bool            as_kernel)
{
    if (interrupt_switch)
        return;

    if (workspace.st == workspace.end)
        return;

    if (workspace.tmat_sep.empty())
    {
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
        if (workspace.ix_arr[workspace.st] >= workspace.n_from)
            return;
        if (workspace.ix_arr[workspace.end] < workspace.n_from)
            return;
    }

    /* Note: the first separation step will not be added here, as it simply consists of adding +1
       to every combination regardless. It has to be added at the end in 'gather_sim_result' to
       obtain the average separation depth. */
    if (trees[curr_tree].tree_left == 0)
    {
        ldouble_safe rem = (ldouble_safe) trees[curr_tree].remainder;
        if (workspace.weights_arr.empty())
        {
            if (!as_kernel)
            {
                rem += (ldouble_safe)(workspace.end - workspace.st + 1);
                if (!workspace.tmat_sep.empty())
                    increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                          prediction_data.nrows, workspace.tmat_sep.data(),
                                          workspace.assume_full_distr? 3. : expected_separation_depth(rem));
                else if (!workspace.rmat.empty())
                    increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                    workspace.n_from, prediction_data.nrows, workspace.rmat.data(),
                                                    workspace.assume_full_distr? 3. : expected_separation_depth(rem));
            }

            else
            {
                if (!workspace.tmat_sep.empty())
                {
                    size_t i_, j_;
                    for (size_t i = workspace.st; i < workspace.end; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        for (size_t j = i + 1; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]++;
                        }
                    }
                }

                else if (!workspace.rmat.empty())
                {
                    size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                                   std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                    workspace.ix_arr.begin() + workspace.end + 1,
                                                                    workspace.n_from));
                    double *restrict rmat_this;
                    for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                    {
                        rmat_this = workspace.rmat.data() + workspace.ix_arr[i]*workspace.n_from;
                        for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                        {
                            rmat_this[workspace.ix_arr[j] - workspace.n_from]++;
                        }
                    }
                }
            }
        }

        else
        {
            if (!as_kernel)
            {
                if (!workspace.assume_full_distr)
                {
                    rem += std::accumulate(workspace.ix_arr.begin() + workspace.st,
                                           workspace.ix_arr.begin() + workspace.end,
                                           (ldouble_safe) 0.,
                                           [&workspace](ldouble_safe curr, size_t ix)
                                           {return curr + (ldouble_safe)workspace.weights_arr[ix];}
                                          );
                }

                if (!workspace.tmat_sep.empty())
                    increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                          prediction_data.nrows, workspace.tmat_sep.data(),
                                          workspace.weights_arr.data(),
                                          workspace.assume_full_distr? 3. : expected_separation_depth(rem));
                else if (!workspace.rmat.empty())
                    increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                    workspace.n_from, prediction_data.nrows,
                                                    workspace.rmat.data(), workspace.weights_arr.data(),
                                                    workspace.assume_full_distr? 3. : expected_separation_depth(rem));
            }

            else
            {
                if (!workspace.tmat_sep.empty())
                {
                    size_t i_, j_;
                    double w_this;
                    for (size_t i = workspace.st; i < workspace.end; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        w_this = workspace.weights_arr[i_];
                        for (size_t j = i + 1; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            workspace.tmat_sep[ix_comb(i_, j_, prediction_data.nrows, workspace.tmat_sep.size())]
                                +=
                            w_this * workspace.weights_arr[j_];
                        }
                    }
                }

                else if (!workspace.rmat.empty())
                {
                    size_t n_group = std::distance(workspace.ix_arr.begin() + workspace.st,
                                                   std::lower_bound(workspace.ix_arr.begin() + workspace.st,
                                                                    workspace.ix_arr.begin() + workspace.end + 1,
                                                                    workspace.n_from));
                    double *restrict rmat_this;
                    double w_this;
                    size_t i_, j_;
                    for (size_t i = workspace.st; i < workspace.st + n_group; i++)
                    {
                        i_ = workspace.ix_arr[i];
                        rmat_this = workspace.rmat.data() + i_*workspace.n_from;
                        w_this = workspace.weights_arr[i_];
                        for (size_t j = workspace.st + n_group; j <= workspace.end; j++)
                        {
                            j_ = workspace.ix_arr[j];
                            rmat_this[j_ - workspace.n_from]
                                +=
                            w_this * workspace.weights_arr[j_];
                        }
                    }
                }
            }
        }
        return;
    }

    else if (curr_tree > 0 && !as_kernel)
    {
        if (!workspace.tmat_sep.empty())
        {
            if (workspace.weights_arr.empty())
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(), -1.);
            else
                increase_comb_counter(workspace.ix_arr.data(), workspace.st, workspace.end,
                                      prediction_data.nrows, workspace.tmat_sep.data(),
                                      workspace.weights_arr.data(), -1.);
        }
        else if (!workspace.rmat.empty())
        {
            if (workspace.weights_arr.empty())
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                workspace.n_from, prediction_data.nrows, workspace.rmat.data(), -1.);
            else
                increase_comb_counter_in_groups(workspace.ix_arr.data(), workspace.st, workspace.end,
                                                workspace.n_from, prediction_data.nrows,
                                                workspace.rmat.data(), workspace.weights_arr.data(), -1.);
        }
    }


    /* divide according to tree */
    if (prediction_data.Xc_indptr != NULL && !workspace.tmat_sep.empty())
        std::sort(workspace.ix_arr.begin() + workspace.st, workspace.ix_arr.begin() + workspace.end + 1);
    size_t st_NA, end_NA, split_ix;
    switch (trees[curr_tree].col_type)
    {
        case Numeric:
        {
            if (prediction_data.Xc_indptr == NULL)
                divide_subset_split(workspace.ix_arr.data(),
                                    prediction_data.numeric_data + prediction_data.nrows * trees[curr_tree].col_num,
                                    workspace.st, workspace.end, trees[curr_tree].num_split,
                                    model_outputs.missing_action, st_NA, end_NA, split_ix);
            else
                divide_subset_split(workspace.ix_arr.data(), workspace.st, workspace.end, trees[curr_tree].col_num,
                                    prediction_data.Xc, prediction_data.Xc_ind, prediction_data.Xc_indptr,
                                    trees[curr_tree].num_split, model_outputs.missing_action,
                                    st_NA, end_NA, split_ix);
            break;
        }

        case Categorical:
        {
            switch(model_outputs.cat_split_type)
            {
                case SingleCateg:
                {
                    divide_subset_split(workspace.ix_arr.data(),
                                        prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                        workspace.st, workspace.end, trees[curr_tree].chosen_cat,
                                         model_outputs.missing_action, st_NA, end_NA, split_ix);
                    break;
                }

                case SubSet:
                {
                    if (!trees[curr_tree].cat_split.size())
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end,
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            trees[curr_tree].pct_tree_left < .5, st_NA, end_NA, split_ix);
                    else
                        divide_subset_split(workspace.ix_arr.data(),
                                            prediction_data.categ_data + prediction_data.nrows * trees[curr_tree].col_num,
                                            workspace.st, workspace.end, trees[curr_tree].cat_split.data(),
                                            (int) trees[curr_tree].cat_split.size(),
                                            model_outputs.missing_action, model_outputs.new_cat_action,
                                            (bool)(trees[curr_tree].pct_tree_left < .5), st_NA, end_NA, split_ix);
                    break;
                }
            }
            break;
        }

        default:
        {
            assert(0);
            break;
        }
    }


    /* continue splitting recursively */
    size_t orig_end = workspace.end;
    if (model_outputs.new_cat_action == Weighted && model_outputs.cat_split_type == SubSet && prediction_data.categ_data != NULL) {
        if (model_outputs.missing_action == Fail && trees[curr_tree].col_type == Numeric) {
            st_NA = split_ix;
            end_NA = split_ix;
        }
        goto missing_action_divide;
    }
    switch (model_outputs.missing_action)
    {
        case Impute:
        {
            split_ix = (trees[curr_tree].pct_tree_left >= .5)? end_NA : st_NA;
        }

        case Fail:
        {
            if (split_ix > workspace.st)
            {
                workspace.end = split_ix - 1;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_left,
                                  as_kernel);
            }


            if (split_ix <= orig_end)
            {
                workspace.st  = split_ix;
                workspace.end = orig_end;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_right,
                                  as_kernel);
            }
            break;
        }

        case Divide: /* new_cat_action = 'Weighted' will also fall here */
        {
            /* TODO: this one should also have a parameter 'changed_weoghts' like during fitting */
            missing_action_divide:
          /* TODO: maybe here it shouldn't copy the whole ix_arr,
             but then it'd need to re-generate it from outside too */
            std::vector<double> weights_arr;
            std::vector<size_t> ix_arr;
            if (end_NA > workspace.st)
            {
                weights_arr.assign(workspace.weights_arr.begin(),
                                   workspace.weights_arr.begin() + end_NA);
                ix_arr.assign(workspace.ix_arr.begin(),
                              workspace.ix_arr.begin() + end_NA);
            }

            if (end_NA > workspace.st)
            {
                workspace.end = end_NA - 1;
                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= trees[curr_tree].pct_tree_left;
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_left,
                                  as_kernel);
            }

            if (st_NA <= orig_end)
            {
                workspace.st = st_NA;
                workspace.end = orig_end;
                if (!weights_arr.empty())
                {
                    std::copy(weights_arr.begin(),
                              weights_arr.end(),
                              workspace.weights_arr.begin());
                    std::copy(ix_arr.begin(),
                              ix_arr.end(),
                              workspace.ix_arr.begin());
                    weights_arr.clear();
                    weights_arr.shrink_to_fit();
                    ix_arr.clear();
                    ix_arr.shrink_to_fit();
                }

                for (size_t row = st_NA; row < end_NA; row++)
                    workspace.weights_arr[workspace.ix_arr[row]] *= (1. - trees[curr_tree].pct_tree_left);
                traverse_tree_sim<PredictionData, ldouble_safe>(
                                  workspace,
                                  prediction_data,
                                  model_outputs,
                                  trees,
                                  trees[curr_tree].tree_right,
                                  as_kernel);
            }
            break;
        }
    }
}